

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive * archive_write_new(void)

{
  uchar *puVar1;
  uchar *nulls;
  archive_write *a;
  
  a = (archive_write *)calloc(1,0x158);
  if (a == (archive_write *)0x0) {
    a = (archive_write *)0x0;
  }
  else {
    (a->archive).magic = 0xb0c5c0de;
    (a->archive).state = 1;
    (a->archive).vtable = &archive_write_vtable;
    a->bytes_per_block = 0x2800;
    a->bytes_in_last_block = -1;
    a->null_length = 0x400;
    puVar1 = (uchar *)calloc(a->null_length,1);
    if (puVar1 == (uchar *)0x0) {
      free(a);
      a = (archive_write *)0x0;
    }
    else {
      a->nulls = puVar1;
    }
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_write_new(void)
{
	struct archive_write *a;
	unsigned char *nulls;

	a = calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_WRITE_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = &archive_write_vtable;
	/*
	 * The value 10240 here matches the traditional tar default,
	 * but is otherwise arbitrary.
	 * TODO: Set the default block size from the format selected.
	 */
	a->bytes_per_block = 10240;
	a->bytes_in_last_block = -1;	/* Default */

	/* Initialize a block of nulls for padding purposes. */
	a->null_length = 1024;
	nulls = calloc(a->null_length, sizeof(unsigned char));
	if (nulls == NULL) {
		free(a);
		return (NULL);
	}
	a->nulls = nulls;
	return (&a->archive);
}